

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_objlen(lua_State *L,StkId ra,TValue *rb)

{
  Table *t;
  Table *events;
  uint uVar1;
  int iVar2;
  TValue *f;
  Value VVar3;
  TValue *io;
  
  uVar1 = rb->tt_ & 0x3f;
  if (uVar1 == 4) {
    VVar3.i._1_7_ = 0;
    VVar3.b._0_1_ = (rb->value_).f[0xb];
  }
  else {
    if (uVar1 != 0x14) {
      if (uVar1 == 5) {
        t = (Table *)(rb->value_).gc;
        events = t->metatable;
        if ((events == (Table *)0x0) || ((events->flags & 0x10) != 0)) {
          f = (TValue *)0x0;
        }
        else {
          f = luaT_gettm(events,TM_LEN,L->l_G->tmname[4]);
        }
        if (f == (TValue *)0x0) {
          iVar2 = luaH_getn(t);
          VVar3 = (Value)(long)iVar2;
          goto LAB_0011130f;
        }
      }
      else {
        f = luaT_gettmbyobj(L,rb,TM_LEN);
        if (f->tt_ == 0) {
          luaG_typeerror(L,rb,"get length of");
        }
      }
      luaT_callTM(L,f,rb,rb,ra,1);
      return;
    }
    VVar3 = *(Value *)((rb->value_).f + 0x10);
  }
LAB_0011130f:
  ra->value_ = VVar3;
  ra->tt_ = 0x13;
  return;
}

Assistant:

void luaV_objlen (lua_State *L, StkId ra, const TValue *rb) {
  const TValue *tm;
  switch (ttype(rb)) {
    case LUA_TTABLE: {
      Table *h = hvalue(rb);
      tm = fasttm(L, h->metatable, TM_LEN);
      if (tm) break;  /* metamethod? break switch to call it */
      setivalue(ra, luaH_getn(h));  /* else primitive len */
      return;
    }
    case LUA_TSHRSTR: {
      setivalue(ra, tsvalue(rb)->shrlen);
      return;
    }
    case LUA_TLNGSTR: {
      setivalue(ra, tsvalue(rb)->u.lnglen);
      return;
    }
    default: {  /* try metamethod */
      tm = luaT_gettmbyobj(L, rb, TM_LEN);
      if (ttisnil(tm))  /* no metamethod? */
        luaG_typeerror(L, rb, "get length of");
      break;
    }
  }
  luaT_callTM(L, tm, rb, rb, ra, 1);
}